

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

application * __thiscall cppcms::application::root(application *this)

{
  application *this_local;
  application *local_8;
  
  if (this->root_ == this->root_->root_) {
    local_8 = this->root_;
  }
  else {
    do {
      this->root_ = this->root_->root_;
    } while (this->root_->root_ != this->root_);
    local_8 = this->root_;
  }
  return local_8;
}

Assistant:

application *application::root()
{
	if(root_ == root_->root_)
		return root_;
	do {
		root_ = root_->root_;
	}
	while(root_->root_ != root_);
	return root_;
}